

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkMiter(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fComb,int nPartSize,int fImplic,int fMulti)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int fRemove2;
  int fRemove1;
  Abc_Ntk_t *pTemp;
  int fMulti_local;
  int fImplic_local;
  int nPartSize_local;
  int fComb_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  _fRemove2 = (Abc_Ntk_t *)0x0;
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk1);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x3f,"Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk2);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x40,"Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Abc_NtkCompareSignals(pNtk1,pNtk2,fImplic,fComb);
  if (iVar1 == 0) {
    return (Abc_Ntk_t *)0x0;
  }
  iVar1 = Abc_NtkIsStrash(pNtk1);
  if (iVar1 == 0) {
LAB_003373fc:
    pNtk2_local = Abc_NtkStrash(pNtk1,0,0,0);
    bVar2 = pNtk2_local != (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Abc_NtkGetChoiceNum(pNtk1);
    bVar2 = false;
    pNtk2_local = pNtk1;
    if (iVar1 != 0) goto LAB_003373fc;
  }
  iVar1 = Abc_NtkIsStrash(pNtk2);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkGetChoiceNum(pNtk2);
    bVar3 = false;
    _nPartSize_local = pNtk2;
    if (iVar1 == 0) goto LAB_00337464;
  }
  _nPartSize_local = Abc_NtkStrash(pNtk2,0,0,0);
  bVar3 = _nPartSize_local != (Abc_Ntk_t *)0x0;
LAB_00337464:
  if ((pNtk2_local != (Abc_Ntk_t *)0x0) && (_nPartSize_local != (Abc_Ntk_t *)0x0)) {
    _fRemove2 = Abc_NtkMiterInt(pNtk2_local,_nPartSize_local,fComb,nPartSize,fImplic,fMulti);
  }
  if (bVar2) {
    Abc_NtkDelete(pNtk2_local);
  }
  if (bVar3) {
    Abc_NtkDelete(_nPartSize_local);
  }
  return _fRemove2;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiter( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fComb, int nPartSize, int fImplic, int fMulti )
{
    Abc_Ntk_t * pTemp = NULL;
    int fRemove1, fRemove2;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk1) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk2) );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, fImplic, fComb ) )
        return NULL;
    // make sure the circuits are strashed 
    fRemove1 = (!Abc_NtkIsStrash(pNtk1) || Abc_NtkGetChoiceNum(pNtk1)) && (pNtk1 = Abc_NtkStrash(pNtk1, 0, 0, 0));
    fRemove2 = (!Abc_NtkIsStrash(pNtk2) || Abc_NtkGetChoiceNum(pNtk2)) && (pNtk2 = Abc_NtkStrash(pNtk2, 0, 0, 0));
    if ( pNtk1 && pNtk2 )
        pTemp = Abc_NtkMiterInt( pNtk1, pNtk2, fComb, nPartSize, fImplic, fMulti );
    if ( fRemove1 )  Abc_NtkDelete( pNtk1 );
    if ( fRemove2 )  Abc_NtkDelete( pNtk2 );
    return pTemp;
}